

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_Brep * ON_BrepWedge(ON_3dPoint *corners,ON_Brep *pBrep)

{
  double dVar1;
  ON_Point *pOVar2;
  ON_Point *pOVar3;
  ON_Point *pOVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ON_Brep *pOVar8;
  ON_3dPoint *pOVar9;
  ON_CurveArray *pOVar10;
  ON_BrepVertex *pOVar11;
  ON_BrepVertex *v1_00;
  ON_LineCurve *pOVar12;
  ON_Surface **ppOVar13;
  double *pdVar14;
  ON_BrepFace *face_00;
  ON_BrepLoop *loop_00;
  ON_BrepTrim *pOVar15;
  TYPE TVar16;
  bool bVar17;
  double in_XMM1_Qa;
  int local_25c;
  ON_BrepTrim *trim;
  ON_BrepLoop *loop;
  ON_BrepFace *face;
  ON_2dPoint p3;
  ON_2dPoint p2;
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON_Interval t;
  ON_Interval s;
  ON_3dPoint local_1a8;
  ON_NurbsSurface *local_190;
  ON_NurbsSurface *srf;
  ON_BrepVertex *v3;
  ON_BrepVertex *v2;
  ON_BrepVertex *v1_3;
  ON_BrepVertex *v0_3;
  ON_BrepEdge *e3;
  ON_BrepEdge *e2;
  ON_BrepEdge *e1;
  ON_BrepEdge *e0;
  anon_struct_32_2_fe3f1d9c f [5];
  ON_BrepVertex *v1_2;
  ON_BrepVertex *v0_2;
  ON_BrepVertex *local_88;
  ON_BrepVertex *v1_1;
  ON_BrepVertex *v0_1;
  ON_BrepVertex *local_70;
  ON_BrepVertex *v1;
  ON_BrepVertex *v0;
  double local_58;
  double local_50;
  int local_38;
  int local_34;
  int c2i;
  int si;
  int fi;
  int ti;
  int ei;
  int vi;
  ON_Brep *brep;
  ON_Brep *pBrep_local;
  ON_3dPoint *corners_local;
  
  _ei = (ON_Brep *)0x0;
  if (corners == (ON_3dPoint *)0x0) {
    _ei = (ON_Brep *)0x0;
  }
  else {
    brep = pBrep;
    pBrep_local = (ON_Brep *)corners;
    if (pBrep == (ON_Brep *)0x0) {
      pOVar8 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(pOVar8);
      _ei = pOVar8;
    }
    else {
      ON_Brep::Destroy(pBrep);
      _ei = brep;
    }
    ON_SimpleArray<ON_Curve_*>::Reserve(&(_ei->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x12);
    ON_SimpleArray<ON_Curve_*>::Reserve(&(_ei->m_C3).super_ON_SimpleArray<ON_Curve_*>,9);
    ON_SimpleArray<ON_Surface_*>::Reserve(&(_ei->m_S).super_ON_SimpleArray<ON_Surface_*>,5);
    ON_ClassArray<ON_BrepVertex>::Reserve((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,6);
    ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,9);
    ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&_ei->m_L,5);
    ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&_ei->m_T,0x12);
    ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&_ei->m_F,5);
    for (ti = 0; ti < 6; ti = ti + 1) {
      pOVar9 = (ON_3dPoint *)((long)&pBrep_local->super_ON_Geometry + (long)ti * 0x18);
      v0 = (ON_BrepVertex *)pOVar9->x;
      local_58 = pOVar9->y;
      local_50 = pOVar9->z;
      ON_Brep::NewVertex(_ei,*pOVar9,0.0);
    }
    for (fi = 0; fi < 3; fi = fi + 1) {
      v1 = ON_ClassArray<ON_BrepVertex>::operator[]((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,fi);
      local_70 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,fi + 1 + ((fi + 1) / 3) * -3);
      pOVar10 = &_ei->m_C3;
      pOVar11 = (ON_BrepVertex *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                ((ON_LineCurve *)pOVar11,&(v1->super_ON_Point).point,
                 &(local_70->super_ON_Point).point);
      v0_1 = pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&pOVar10->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&v0_1);
      ON_Brep::NewEdge(_ei,v1,local_70,fi,(ON_Interval *)0x0,0.0);
    }
    for (fi = 3; fi < 6; fi = fi + 1) {
      v1_1 = ON_ClassArray<ON_BrepVertex>::operator[]((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,fi);
      if (fi == 5) {
        local_25c = 3;
      }
      else {
        local_25c = fi + 1;
      }
      local_88 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,local_25c);
      pOVar10 = &_ei->m_C3;
      pOVar11 = (ON_BrepVertex *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                ((ON_LineCurve *)pOVar11,&(v1_1->super_ON_Point).point,
                 &(local_88->super_ON_Point).point);
      v0_2 = pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&pOVar10->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&v0_2);
      ON_Brep::NewEdge(_ei,v1_1,local_88,fi,(ON_Interval *)0x0,0.0);
    }
    for (fi = 6; fi < 9; fi = fi + 1) {
      pOVar11 = ON_ClassArray<ON_BrepVertex>::operator[]
                          ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,fi + -6);
      v1_00 = ON_ClassArray<ON_BrepVertex>::operator[]
                        ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,fi + -3);
      pOVar10 = &_ei->m_C3;
      pOVar12 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar12,&(pOVar11->super_ON_Point).point,&(v1_00->super_ON_Point).point);
      f[4].bRev._8_8_ = pOVar12;
      ON_SimpleArray<ON_Curve_*>::Append
                (&pOVar10->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)(f[4].bRev + 2));
      ON_Brep::NewEdge(_ei,pOVar11,v1_00,fi,(ON_Interval *)0x0,0.0);
    }
    memcpy(&e0,&DAT_009e44b0,0xa0);
    for (c2i = 0; c2i < 5; c2i = c2i + 1) {
      v0_3 = (ON_BrepVertex *)0x0;
      e1 = ON_ClassArray<ON_BrepEdge>::operator[]
                     ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[(long)c2i + -1].bRev[2]);
      e2 = ON_ClassArray<ON_BrepEdge>::operator[]
                     ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[(long)c2i + -1].bRev[3]);
      e3 = ON_ClassArray<ON_BrepEdge>::operator[]
                     ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[c2i].e[0]);
      if (-1 < f[c2i].e[1]) {
        v0_3 = (ON_BrepVertex *)
               ON_ClassArray<ON_BrepEdge>::operator[]
                         ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[c2i].e[1]);
      }
      srf = (ON_NurbsSurface *)0x0;
      v1_3 = ON_ClassArray<ON_BrepVertex>::operator[]
                       ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                        e1->m_vi[(int)(uint)(f[c2i].e[2] != 0)]);
      v2 = ON_ClassArray<ON_BrepVertex>::operator[]
                     ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                      e2->m_vi[(int)(uint)(f[c2i].e[3] != 0)]);
      v3 = ON_ClassArray<ON_BrepVertex>::operator[]
                     ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                      e3->m_vi[(int)(uint)(f[c2i].bRev[0] != 0)]);
      if (-1 < f[c2i].e[1]) {
        srf = (ON_NurbsSurface *)
              ON_ClassArray<ON_BrepVertex>::operator[]
                        ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                         *(int *)((long)&v0_3->m_tolerance +
                                 (long)(int)(uint)(f[c2i].bRev[1] != 0) * 4 + 4));
      }
      if (f[c2i].e[1] < 0) {
        pOVar2 = &v1_3->super_ON_Point;
        pOVar3 = &v2->super_ON_Point;
        pOVar4 = &v2->super_ON_Point;
        ON_3dPoint::operator-
                  ((ON_3dVector *)(s.m_t + 1),&(v3->super_ON_Point).point,
                   &(v1_3->super_ON_Point).point);
        ON_3dPoint::operator+(&local_1a8,&pOVar4->point,(ON_3dVector *)(s.m_t + 1));
        local_190 = ON_NurbsSurfaceQuadrilateral
                              (&pOVar2->point,&pOVar3->point,&local_1a8,&(v3->super_ON_Point).point,
                               (ON_NurbsSurface *)0x0);
      }
      else {
        local_190 = ON_NurbsSurfaceQuadrilateral
                              (&(v1_3->super_ON_Point).point,&(v2->super_ON_Point).point,
                               &(v3->super_ON_Point).point,(ON_3dPoint *)&srf->m_dim,
                               (ON_NurbsSurface *)0x0);
      }
      local_34 = ON_Brep::AddSurface(_ei,&local_190->super_ON_Surface);
      ppOVar13 = ON_SimpleArray<ON_Surface_*>::operator[]
                           (&(_ei->m_S).super_ON_SimpleArray<ON_Surface_*>,local_34);
      (*((*ppOVar13)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(*ppOVar13,0);
      s.m_t[0] = in_XMM1_Qa;
      ppOVar13 = ON_SimpleArray<ON_Surface_*>::operator[]
                           (&(_ei->m_S).super_ON_SimpleArray<ON_Surface_*>,local_34);
      (*((*ppOVar13)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])();
      t.m_t[0] = in_XMM1_Qa;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(t.m_t + 1),0);
      dVar1 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&p0.y,0);
      ON_2dPoint::Set((ON_2dPoint *)&p1.y,dVar1,*pdVar14);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(t.m_t + 1),1);
      dVar1 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&p0.y,0);
      ON_2dPoint::Set((ON_2dPoint *)&p2.y,dVar1,*pdVar14);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(t.m_t + 1),1);
      dVar1 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&p0.y,1);
      ON_2dPoint::Set((ON_2dPoint *)&p3.y,dVar1,*pdVar14);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(t.m_t + 1),0);
      dVar1 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&p0.y,1);
      in_XMM1_Qa = *pdVar14;
      ON_2dPoint::Set((ON_2dPoint *)&face,dVar1,in_XMM1_Qa);
      face_00 = ON_Brep::NewFace(_ei,local_34);
      loop_00 = ON_Brep::NewLoop(_ei,outer,face_00);
      pOVar8 = _ei;
      if (f[c2i].e[1] < 0) {
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&p1.y,(ON_2dPoint *)&p2.y);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,e1,f[c2i].e[2] != 0,loop_00,local_38);
        pOVar8 = _ei;
        pOVar15->m_iso = S_iso;
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&p2.y,(ON_2dPoint *)&face);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,e2,f[c2i].e[3] != 0,loop_00,local_38);
        pOVar8 = _ei;
        pOVar15->m_iso = not_iso;
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&face,(ON_2dPoint *)&p1.y);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,e3,f[c2i].bRev[0] != 0,loop_00,local_38);
        pOVar15->m_iso = W_iso;
      }
      else {
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&p1.y,(ON_2dPoint *)&p2.y);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,e1,f[c2i].e[2] != 0,loop_00,local_38);
        pOVar8 = _ei;
        pOVar15->m_iso = S_iso;
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&p2.y,(ON_2dPoint *)&p3.y);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,e2,f[c2i].e[3] != 0,loop_00,local_38);
        pOVar8 = _ei;
        pOVar15->m_iso = E_iso;
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&p3.y,(ON_2dPoint *)&face);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,e3,f[c2i].bRev[0] != 0,loop_00,local_38);
        pOVar8 = _ei;
        pOVar15->m_iso = N_iso;
        pOVar12 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar12,(ON_2dPoint *)&face,(ON_2dPoint *)&p1.y);
        local_38 = ON_Brep::AddTrimCurve(pOVar8,(ON_Curve *)pOVar12);
        pOVar15 = ON_Brep::NewTrim(_ei,(ON_BrepEdge *)v0_3,f[c2i].bRev[1] != 0,loop_00,local_38);
        pOVar15->m_iso = W_iso;
      }
    }
    for (si = 0; iVar5 = si,
        iVar6 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&_ei->m_T),
        iVar5 < iVar6; si = si + 1) {
      pOVar15 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&_ei->m_T,si);
      bVar17 = false;
      if (pOVar15->m_vi[0] != pOVar15->m_vi[1]) {
        bVar17 = -1 < pOVar15->m_ei;
      }
      TVar16 = singular;
      if (bVar17) {
        TVar16 = mated;
      }
      pOVar15->m_type = TVar16;
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
    }
    uVar7 = (*(_ei->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(_ei,0);
    if ((uVar7 & 1) == 0) {
      if (brep == (ON_Brep *)0x0) {
        if (_ei != (ON_Brep *)0x0) {
          (*(_ei->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
      }
      else {
        ON_Brep::Destroy(brep);
      }
      _ei = (ON_Brep *)0x0;
    }
  }
  return _ei;
}

Assistant:

ON_Brep* ON_BrepWedge( const ON_3dPoint* corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;

  int vi, ei, ti, fi, si, c2i;
  
  if(corners)
  {
    // use the one passed in or make a new one
    if( pBrep ) 
    {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    
    brep->m_C2.Reserve(18);
    brep->m_C3.Reserve(9);
    brep->m_S.Reserve(5);
    brep->m_V.Reserve(6);
    brep->m_E.Reserve(9);
    brep->m_L.Reserve(5);
    brep->m_T.Reserve(18);
    brep->m_F.Reserve(5);

    // vertices
    for ( vi = 0; vi < 6; vi++ )
    {
      brep->NewVertex( corners[vi], 0.0 );
    }
    
    // 3d edges around bottom e0 - e2
    for ( ei = 0; ei < 3; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d edges around top e3 - e5
    for ( ei = 3; ei < 6; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==5?3:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d vertical edges e6 - e8
    for ( ei = 6; ei < 9; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-6];
      ON_BrepVertex& v1 = brep->m_V[ei-3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //
    //                      /v5    
    //                     /|\       
    //                    / | \     
    //                   e5 |  e4   
    //                  /   e8  \     
    //                 /__e3_____\  
    //               v3|    |    |v4     
    //                 |    |    |       
    //                 |    /v2  |   
    //                 e6  / \   e7   
    //                 |  /   \  |   
    //                 | e2    e1|   
    //                 |/       \|     
    //                 /____e0___\  
    //               v0           v1
    */

    struct {
      int e[4], bRev[4];
    } f[5] = {
      {{0, 7, 3, 6},  {false, false, true,  true}},  // vertical front
      {{1, 8, 4, 7},  {false, false, true,  true}},  // vertical right
      {{2, 6, 5, 8},  {false, false, true,  true}},  // vertical left
      {{2, 1, 0,-1},  {true,  true,  true,  true}},  // bottom
      {{3, 4, 5,-1},  {false, false, false, false}}  // top
    };
    for ( fi = 0; fi < 5; fi++ )
    {
      ON_BrepEdge* e0;
      ON_BrepEdge* e1;
      ON_BrepEdge* e2;
      ON_BrepEdge* e3=0;

      e0 = &brep->m_E[f[fi].e[0]];
      e1 = &brep->m_E[f[fi].e[1]];
      e2 = &brep->m_E[f[fi].e[2]];
      if( f[fi].e[3] >= 0)
        e3 = &brep->m_E[f[fi].e[3]];

      ON_BrepVertex* v0;
      ON_BrepVertex* v1;
      ON_BrepVertex* v2;
      ON_BrepVertex* v3=0;

      v0 = &brep->m_V[e0->m_vi[f[fi].bRev[0]?1:0]];
      v1 = &brep->m_V[e1->m_vi[f[fi].bRev[1]?1:0]];
      v2 = &brep->m_V[e2->m_vi[f[fi].bRev[2]?1:0]];
      if( f[fi].e[3] >= 0)
        v3 = &brep->m_V[e3->m_vi[f[fi].bRev[3]?1:0]];

      ON_NurbsSurface* srf;

      if( f[fi].e[3] >= 0)
        // 4 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v2->point, v3->point);
      else
        // 3 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v1->point + (v2->point - v0->point), v2->point);

      si = brep->AddSurface( srf);

      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0, p1, p2, p3;
      p0.Set(s[0],t[0]);
      p1.Set(s[1],t[0]);
      p2.Set(s[1],t[1]);
      p3.Set(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      if( f[fi].e[3] >= 0)
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // east side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::E_iso;
        
        // north side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::N_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e3, f[fi].bRev[3], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
      else
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // diagonal from upper left to lower right
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p3 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::not_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
    }

    // set trim m_type and m_tolerance[]
    for ( ti = 0; ti < brep->m_T.Count(); ti++ )
    {
      ON_BrepTrim& trim = brep->m_T[ti];
      trim.m_type =  ( trim.m_vi[0] != trim.m_vi[1] && trim.m_ei >= 0 )
                  ? ON_BrepTrim::mated
                  : ON_BrepTrim::singular;
      trim.m_tolerance[0] = 0.0;
      trim.m_tolerance[1] = 0.0;
    }

    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}